

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O3

ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> * __thiscall
flow::IRProgram::get<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,flow::util::Cidr>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
          *table,Cidr *literal)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *this_00;
  pointer puVar7;
  long lVar8;
  pointer *__ptr;
  long lVar9;
  undefined8 *puVar10;
  Cidr *pCVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  _Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false> local_88;
  undefined1 local_80 [80];
  
  bVar14 = 0;
  lVar12 = (long)(table->
                 super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(table->
                 super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    lVar13 = 0;
    lVar9 = 0;
    do {
      puVar10 = (undefined8 *)
                ((long)(table->
                       super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                       super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                       ._M_t + 0x48);
      pCVar11 = (Cidr *)local_80;
      for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar1 = *puVar10;
        (pCVar11->ipaddr_).family_ = (int)uVar1;
        (pCVar11->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
        (pCVar11->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
        (pCVar11->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
        (pCVar11->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
        puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
        pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar14 * -0x10 + 8);
      }
      bVar6 = util::operator==((Cidr *)local_80,literal);
      if (bVar6) {
        puVar7 = (pointer)((long)(table->
                                 super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start - lVar13);
        goto LAB_00147a6d;
      }
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + -8;
    } while (lVar12 >> 3 != lVar9);
  }
  this_00 = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)operator_new(0x98);
  local_80._8_8_ = 0;
  local_80[0x10] = '\0';
  local_80._0_8_ = local_80 + 0x10;
  Value::Value((Value *)this_00,Cidr,(string *)local_80);
  (this_00->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__Value_00195198;
  pCVar11 = &this_00->value_;
  for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
    cVar2 = (literal->ipaddr_).cstr_[0];
    cVar3 = (literal->ipaddr_).cstr_[1];
    cVar4 = (literal->ipaddr_).cstr_[2];
    cVar5 = (literal->ipaddr_).cstr_[3];
    (pCVar11->ipaddr_).family_ = (literal->ipaddr_).family_;
    (pCVar11->ipaddr_).cstr_[0] = cVar2;
    (pCVar11->ipaddr_).cstr_[1] = cVar3;
    (pCVar11->ipaddr_).cstr_[2] = cVar4;
    (pCVar11->ipaddr_).cstr_[3] = cVar5;
    literal = (Cidr *)((long)literal + (ulong)bVar14 * -0x10 + 8);
    pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar14 * -0x10 + 8);
  }
  local_88._M_head_impl = this_00;
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,CONCAT71(local_80._17_7_,local_80[0x10]) + 1);
  }
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
  ::
  emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>
            ((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
              *)table,(unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                       *)&local_88);
  if (local_88._M_head_impl != (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0) {
    (*((local_88._M_head_impl)->super_Constant).super_Value._vptr_Value[1])();
  }
  puVar7 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00147a6d:
  return (puVar7->_M_t).
         super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
         .
         super__Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false>
         ._M_head_impl;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}